

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDB_ModuleInfoStream.cpp
# Opt level: O1

Module * __thiscall PDB::ModuleInfoStream::FindLinkerModule(ModuleInfoStream *this)

{
  Module *pMVar1;
  int iVar2;
  size_t sVar3;
  
  sVar3 = this->m_moduleCount;
  if (sVar3 != 0) {
    pMVar1 = this->m_modules + sVar3;
    do {
      iVar2 = strcmp(pMVar1[-1].m_name,"* Linker *");
      if (iVar2 == 0) {
        return pMVar1 + -1;
      }
      sVar3 = sVar3 - 1;
      pMVar1 = pMVar1 + -1;
    } while (sVar3 != 0);
  }
  return (Module *)0x0;
}

Assistant:

PDB_NO_DISCARD const PDB::ModuleInfoStream::Module* PDB::ModuleInfoStream::FindLinkerModule(void) const PDB_NO_EXCEPT
{
	const size_t count = m_moduleCount;
	for (size_t i = 0u; i < count; ++i)
	{
		// with both MSVC cl.exe and Clang, the linker symbol is the last one to be stored, so start searching from the end
		const Module& module = m_modules[count - i - 1u];

		// check if this is the linker symbol
		if (std::strcmp(module.GetName().Decay(), LinkerSymbolName) == 0)
		{
			return &module;
		}
	}

	return nullptr;
}